

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

void __thiscall
cmGeneratorTarget::ComputeLinkImplementationRuntimeLibraries
          (cmGeneratorTarget *this,string *config,cmOptionalLinkImplementation *impl)

{
  cmMakefile *this_00;
  pointer pbVar1;
  cmGeneratorTarget *t;
  bool bVar2;
  iterator iVar3;
  cmValue cVar4;
  mapped_type *pmVar5;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>_>
  *this_01;
  pointer __lhs;
  cmGeneratorTarget *pcVar6;
  pointer name;
  string_view arg;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> implicitTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  libsVec;
  cmListFileBacktrace bt;
  TargetOrString resolved;
  vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_> local_178;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_158;
  cmGeneratorTarget *local_140;
  string *local_138;
  pointer local_130;
  cmLocalGenerator *local_128;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_120;
  __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  local_110;
  string local_100;
  TargetOrString local_e0;
  cmLinkItem local_b8;
  
  __lhs = (impl->super_cmLinkImplementation).Languages.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  local_130 = (impl->super_cmLinkImplementation).Languages.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = &(impl->super_cmLinkImplementation).LanguageRuntimeLibraries;
  local_140 = this;
  local_138 = config;
  do {
    if (__lhs == local_130) {
      return;
    }
    bVar2 = std::operator==(__lhs,"CUDA");
    if (bVar2) {
LAB_002e1f62:
      iVar3 = std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find(&this_01->_M_h,__lhs);
      if (iVar3.
          super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_true>
          ._M_cur == (__node_type *)0x0) {
        cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack
                  ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_120);
        pcVar6 = local_140;
        local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_178.super__Vector_base<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_128 = local_140->LocalGenerator;
        GetRuntimeLinkLibrary(&local_100,local_140,__lhs,local_138);
        this_00 = pcVar6->Makefile;
        std::operator+(&local_e0.String,"CMAKE_",__lhs);
        std::operator+(&local_b8.String,&local_e0.String,"_RUNTIME_LIBRARIES_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &stack0xffffffffffffff88,&local_b8.String,&local_100);
        cVar4 = cmMakefile::GetDefinition
                          (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)&stack0xffffffffffffff88);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff88);
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_e0);
        if (cVar4.Value != (string *)0x0) {
          arg._M_str = ((cVar4.Value)->_M_dataplus)._M_p;
          arg._M_len = (cVar4.Value)->_M_string_length;
          cmExpandedList_abi_cxx11_(&local_158,arg,false);
          pcVar6 = (cmGeneratorTarget *)
                   ((long)local_158.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_158.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5);
          std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::reserve
                    (&local_178,(size_type)pcVar6);
          pbVar1 = local_158.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (name = local_158.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; name != pbVar1; name = name + 1) {
            ResolveTargetReference(&local_e0,pcVar6,name,local_128);
            t = local_e0.Target;
            if (local_e0.Target != (cmGeneratorTarget *)0x0) {
              std::
              __shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ::__shared_ptr(&local_110,&local_120);
              cmLinkItem::cmLinkItem(&local_b8,t,false,(cmListFileBacktrace *)&local_110);
              cmLinkImplItem::cmLinkImplItem
                        ((cmLinkImplItem *)&stack0xffffffffffffff88,&local_b8,false);
              cmLinkItem::~cmLinkItem(&local_b8);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_110._M_refcount);
              pcVar6 = (cmGeneratorTarget *)&stack0xffffffffffffff88;
              std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::
              emplace_back<cmLinkImplItem>(&local_178,(cmLinkImplItem *)&stack0xffffffffffffff88);
              cmLinkItem::~cmLinkItem((cmLinkItem *)&stack0xffffffffffffff88);
            }
            std::__cxx11::string::~string((string *)&local_e0);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_158);
        }
        std::__cxx11::string::~string((string *)&local_100);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_120._M_refcount);
        pmVar5 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this_01,__lhs);
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::_M_move_assign
                  (pmVar5,&local_178);
        std::vector<cmLinkImplItem,_std::allocator<cmLinkImplItem>_>::~vector(&local_178);
      }
    }
    else {
      bVar2 = std::operator==(__lhs,"HIP");
      if (bVar2) goto LAB_002e1f62;
    }
    __lhs = __lhs + 1;
  } while( true );
}

Assistant:

void cmGeneratorTarget::ComputeLinkImplementationRuntimeLibraries(
  const std::string& config, cmOptionalLinkImplementation& impl) const
{
  for (std::string const& lang : impl.Languages) {
    if ((lang == "CUDA" || lang == "HIP") &&
        impl.LanguageRuntimeLibraries.find(lang) ==
          impl.LanguageRuntimeLibraries.end()) {
      auto implicitTargets =
        computeImplicitLanguageTargets<cmLinkImplItem>(lang, config, this);
      impl.LanguageRuntimeLibraries[lang] = std::move(implicitTargets);
    }
  }
}